

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcErrorList.cpp
# Opt level: O2

void __thiscall GrcErrorList::WriteTableVersionsGenerated(GrcErrorList *this,ostream *strmOut)

{
  int fxdVersion;
  ostream *poVar1;
  string local_40;
  
  std::operator<<(strmOut,"Table versions generated:\n");
  WriteTableDescriptionString(strmOut,ktiSilf);
  WriteTableDescriptionString(strmOut,ktiGloc);
  WriteTableDescriptionString(strmOut,ktiGlat);
  WriteTableDescriptionString(strmOut,ktiFeat);
  WriteTableDescriptionString(strmOut,ktiSill);
  fxdVersion = g_cman.m_fxdCompilerVersion;
  poVar1 = std::operator<<(strmOut,"Minimal compiler version required: ");
  VersionString_abi_cxx11_(&local_40,fxdVersion);
  poVar1 = std::operator<<(poVar1,(string *)&local_40);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_40);
  std::operator<<(strmOut,"\n*******************************************************\n\n");
  return;
}

Assistant:

void GrcErrorList::WriteTableVersionsGenerated(std::ostream& strmOut)
{
	strmOut << "Table versions generated:\n";

	WriteTableDescriptionString(strmOut, ktiSilf);
	WriteTableDescriptionString(strmOut, ktiGloc);
	WriteTableDescriptionString(strmOut, ktiGlat);
	WriteTableDescriptionString(strmOut, ktiFeat);
	WriteTableDescriptionString(strmOut, ktiSill);

	const int fxd = g_cman.CompilerVersion();
	strmOut << "Minimal compiler version required: " << VersionString(fxd) << "\n";

	strmOut << "\n*******************************************************\n\n";
}